

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

void __thiscall libtorrent::aux::http_parser::reset(http_parser *this)

{
  span<const_char> local_20;
  http_parser *local_10;
  http_parser *this_local;
  
  local_10 = this;
  ::std::__cxx11::string::clear();
  this->m_recv_pos = 0;
  this->m_body_start_pos = 0;
  this->m_status_code = -1;
  this->m_content_length = -1;
  this->m_range_start = -1;
  this->m_range_end = -1;
  this->m_finished = false;
  this->m_state = read_status;
  span<const_char>::span(&local_20);
  (this->m_recv_buffer).m_ptr = local_20.m_ptr;
  (this->m_recv_buffer).m_len = local_20.m_len;
  ::std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::strview_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->m_header);
  this->m_chunked_encoding = false;
  ::std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::clear
            (&this->m_chunked_ranges);
  this->m_cur_chunk_end = -1;
  this->m_chunk_header_size = 0;
  this->m_partial_chunk_header = 0;
  return;
}

Assistant:

void http_parser::reset()
	{
		m_method.clear();
		m_recv_pos = 0;
		m_body_start_pos = 0;
		m_status_code = -1;
		m_content_length = -1;
		m_range_start = -1;
		m_range_end = -1;
		m_finished = false;
		m_state = read_status;
		m_recv_buffer = span<char const>();
		m_header.clear();
		m_chunked_encoding = false;
		m_chunked_ranges.clear();
		m_cur_chunk_end = -1;
		m_chunk_header_size = 0;
		m_partial_chunk_header = 0;
	}